

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

uint8_t bcm2835_gpio_lev(uint8_t pin)

{
  uint32_t uVar1;
  
  if (debug == '\0') {
    uVar1 = bcm2835_gpio[(ulong)(pin >> 5) + 0xd];
  }
  else {
    uVar1 = 0;
    printf("bcm2835_peri_read  paddr %p\n");
  }
  return (uVar1 >> (pin & 0x1f) & 1) != 0;
}

Assistant:

uint8_t bcm2835_gpio_lev(uint8_t pin)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPLEV0/4 + pin/32;
    uint8_t shift = pin % 32;
    uint32_t value = bcm2835_peri_read(paddr);
    return (value & (1 << shift)) ? HIGH : LOW;
}